

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&,slang::syntax::ElseClauseSyntax*>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ConditionalPredicateSyntax *args_5,Token *args_6,StatementSyntax *args_7,
          ElseClauseSyntax **args_8)

{
  ElseClauseSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  ConditionalStatementSyntax *this_00;
  
  this_00 = (ConditionalStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConditionalStatementSyntax *)allocateSlow(this,0xb0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar6 = args_2->kind;
  uVar7 = args_2->field_0x2;
  NVar8.raw = (args_2->numFlags).raw;
  uVar9 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar10 = args_3->kind;
  uVar11 = args_3->field_0x2;
  NVar12.raw = (args_3->numFlags).raw;
  uVar13 = args_3->rawLen;
  pIVar3 = args_3->info;
  TVar14 = args_4->kind;
  uVar15 = args_4->field_0x2;
  NVar16.raw = (args_4->numFlags).raw;
  uVar17 = args_4->rawLen;
  pIVar4 = args_4->info;
  TVar18 = args_6->kind;
  uVar19 = args_6->field_0x2;
  NVar20.raw = (args_6->numFlags).raw;
  uVar21 = args_6->rawLen;
  pIVar5 = args_6->info;
  pEVar1 = *args_8;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,ConditionalStatement,*args,args_1);
  (this_00->uniqueOrPriority).kind = TVar6;
  (this_00->uniqueOrPriority).field_0x2 = uVar7;
  (this_00->uniqueOrPriority).numFlags = (NumericTokenFlags)NVar8.raw;
  (this_00->uniqueOrPriority).rawLen = uVar9;
  (this_00->uniqueOrPriority).info = pIVar2;
  (this_00->ifKeyword).kind = TVar10;
  (this_00->ifKeyword).field_0x2 = uVar11;
  (this_00->ifKeyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (this_00->ifKeyword).rawLen = uVar13;
  (this_00->ifKeyword).info = pIVar3;
  (this_00->openParen).kind = TVar14;
  (this_00->openParen).field_0x2 = uVar15;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (this_00->openParen).rawLen = uVar17;
  (this_00->openParen).info = pIVar4;
  (this_00->predicate).ptr = args_5;
  (this_00->closeParen).kind = TVar18;
  (this_00->closeParen).field_0x2 = uVar19;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (this_00->closeParen).rawLen = uVar21;
  (this_00->closeParen).info = pIVar5;
  (this_00->statement).ptr = args_7;
  this_00->elseClause = pEVar1;
  (args_5->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_7->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  if (pEVar1 != (ElseClauseSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }